

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool __thiscall nivalis::ParseSession::_mk_tok_link(ParseSession *this)

{
  string *psVar1;
  value_type vVar2;
  size_type sVar3;
  bool bVar4;
  long lVar5;
  char *pcVar6;
  reference pvVar7;
  size_type *psVar8;
  ostream *poVar9;
  long in_RDI;
  stringstream error_msg_stream_1;
  int i_1;
  stringstream error_msg_stream;
  int i;
  char c;
  int64_t pos;
  int64_t lit_start;
  vector<long,_std::allocator<long>_> starts [3];
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffb40;
  value_type_conflict3 *in_stack_fffffffffffffb48;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffb50;
  vector<long,_std::allocator<long>_> *local_4a0;
  vector<long,_std::allocator<long>_> *local_3e0;
  string local_3d8 [32];
  stringstream local_3b8 [16];
  ostream local_3a8 [376];
  int local_230;
  undefined4 local_22c;
  string local_228 [32];
  stringstream local_208 [16];
  ostream local_1f8 [376];
  int local_80;
  char local_69;
  size_type local_68;
  size_type local_60;
  vector<long,_std::allocator<long>_> local_58 [3];
  byte local_1;
  
  local_3e0 = local_58;
  do {
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)0x10cf43);
    local_3e0 = local_3e0 + 1;
  } while (local_3e0 != (vector<long,_std::allocator<long>_> *)&stack0xfffffffffffffff0);
  local_60 = 0xffffffffffffffff;
  for (local_68 = 0; sVar3 = local_68, lVar5 = std::__cxx11::string::size(), (long)sVar3 < lVar5;
      local_68 = local_68 + 1) {
    pcVar6 = (char *)std::__cxx11::string::operator[](*(ulong *)(in_RDI + 8));
    local_69 = *pcVar6;
    bVar4 = util::is_identifier('\0');
    if (bVar4) {
      if (local_60 == 0xffffffffffffffff) {
        local_60 = local_68;
      }
    }
    else if (local_60 != 0xffffffffffffffff) {
      lVar5 = local_68 - 1;
      pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)(in_RDI + 0x58),local_60);
      sVar3 = local_60;
      *pvVar7 = lVar5;
      psVar8 = (size_type *)
               std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)(in_RDI + 0x58),local_68 - 1);
      *psVar8 = sVar3;
      local_60 = 0xffffffffffffffff;
    }
    for (local_80 = 0; local_80 < 3; local_80 = local_80 + 1) {
      if (local_69 == "([{"[local_80]) {
        std::vector<long,_std::allocator<long>_>::push_back
                  (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      }
      else if (local_69 == ")]}"[local_80]) {
        bVar4 = std::vector<long,_std::allocator<long>_>::empty(in_stack_fffffffffffffb50);
        sVar3 = local_68;
        if (bVar4) {
          std::__cxx11::stringstream::stringstream(local_208);
          poVar9 = std::operator<<(local_1f8,"Unmatched \'");
          poVar9 = std::operator<<(poVar9,")]}"[local_80]);
          std::operator<<(poVar9,"\'\n");
          if (*(long *)(in_RDI + 0x10) != 0) {
            psVar1 = *(string **)(in_RDI + 0x10);
            std::__cxx11::stringstream::str();
            std::__cxx11::string::append(psVar1);
            std::__cxx11::string::~string(local_228);
          }
          if ((*(byte *)(in_RDI + 0x31) & 1) == 0) {
            poVar9 = std::operator<<((ostream *)&std::cout,"Unmatched \'");
            poVar9 = std::operator<<(poVar9,")]}"[local_80]);
            std::operator<<(poVar9,"\'\n");
          }
          local_1 = 0;
          local_22c = 1;
          std::__cxx11::stringstream::~stringstream(local_208);
          goto LAB_0010d6ab;
        }
        psVar8 = (size_type *)
                 std::vector<long,_std::allocator<long>_>::back(in_stack_fffffffffffffb40);
        psVar8 = (size_type *)
                 std::vector<long,_std::allocator<long>_>::operator[]
                           ((vector<long,_std::allocator<long>_> *)(in_RDI + 0x58),*psVar8);
        *psVar8 = sVar3;
        pvVar7 = std::vector<long,_std::allocator<long>_>::back(in_stack_fffffffffffffb40);
        vVar2 = *pvVar7;
        pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                           ((vector<long,_std::allocator<long>_> *)(in_RDI + 0x58),local_68);
        *pvVar7 = vVar2;
        std::vector<long,_std::allocator<long>_>::pop_back
                  ((vector<long,_std::allocator<long>_> *)0x10d3ce);
      }
    }
  }
  local_230 = 0;
  do {
    if (2 < local_230) {
      if (local_60 != 0xffffffffffffffff) {
        lVar5 = std::__cxx11::string::size();
        pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                           ((vector<long,_std::allocator<long>_> *)(in_RDI + 0x58),local_60);
        sVar3 = local_60;
        *pvVar7 = lVar5 + -1;
        lVar5 = std::__cxx11::string::size();
        psVar8 = (size_type *)
                 std::vector<long,_std::allocator<long>_>::operator[]
                           ((vector<long,_std::allocator<long>_> *)(in_RDI + 0x58),lVar5 - 1);
        *psVar8 = sVar3;
      }
      local_60 = 0xffffffffffffffff;
      local_1 = 1;
      local_22c = 1;
LAB_0010d6ab:
      local_4a0 = (vector<long,_std::allocator<long>_> *)&stack0xfffffffffffffff0;
      do {
        local_4a0 = local_4a0 + -1;
        std::vector<long,_std::allocator<long>_>::~vector(local_4a0);
      } while (local_4a0 != local_58);
      return (bool)(local_1 & 1);
    }
    bVar4 = std::vector<long,_std::allocator<long>_>::empty(in_stack_fffffffffffffb50);
    if (!bVar4) {
      std::__cxx11::stringstream::stringstream(local_3b8);
      poVar9 = std::operator<<(local_3a8,"Unmatched \'");
      poVar9 = std::operator<<(poVar9,"([{"[local_230]);
      std::operator<<(poVar9,"\'\n");
      if (*(long *)(in_RDI + 0x10) != 0) {
        psVar1 = *(string **)(in_RDI + 0x10);
        std::__cxx11::stringstream::str();
        std::__cxx11::string::append(psVar1);
        std::__cxx11::string::~string(local_3d8);
      }
      if ((*(byte *)(in_RDI + 0x31) & 1) == 0) {
        poVar9 = std::operator<<((ostream *)&std::cout,"Unmatched \'");
        poVar9 = std::operator<<(poVar9,"([{"[local_230]);
        std::operator<<(poVar9,"\'\n");
      }
      local_1 = 0;
      local_22c = 1;
      std::__cxx11::stringstream::~stringstream(local_3b8);
      goto LAB_0010d6ab;
    }
    local_230 = local_230 + 1;
  } while( true );
}

Assistant:

bool _mk_tok_link() {
        // Parenthesis matching
        static const char lb[] = "([{", rb[] = ")]}";
        std::vector<int64_t> starts[3];
        int64_t lit_start = -1;
        for (int64_t pos = 0; pos < static_cast<int64_t>(expr.size()); ++pos) {
            const char c = expr[pos];
            if (util::is_identifier(c)) {
                if (lit_start == -1) lit_start = pos;
            } else {
                if (lit_start != -1) {
                    tok_link[lit_start] = pos-1;
                    tok_link[pos-1] = lit_start;
                    lit_start = -1;
                }
            }
            for (int i = 0; i < 3; ++i) {
                if (c == lb[i]) {
                    starts[i].push_back(pos);
                } else if (c == rb[i]) {
                    if (starts[i].empty()) {
                        PARSE_ERR("Unmatched '" << rb[i] << "'\n");
                    }
                    tok_link[starts[i].back()] = pos;
                    tok_link[pos] = starts[i].back();
                    starts[i].pop_back();
                }
            }
        }
        for (int i = 0; i < 3; ++i) {
            if (!starts[i].empty()) {
                PARSE_ERR("Unmatched '" << lb[i] << "'\n");
            }
        }
        if (lit_start != -1) {
            tok_link[lit_start] = static_cast<int64_t>(expr.size()) - 1;
            tok_link[expr.size() - 1] = lit_start;
            lit_start = -1;
        }
        lit_start = -1;
        return true;
    }